

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O1

mat4 * lookat(vec3f eye,vec3f center,vec3f up)

{
  vec<3UL,_double> *pvVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  mat4 *in_RDI;
  bool bVar6;
  double dVar7;
  vec3f z;
  vec3f y;
  double in_stack_00000048;
  vec3f x;
  double local_a8 [4];
  double local_88;
  double local_80;
  vec<3UL,_double> local_78;
  vec<3UL,_double> local_58;
  vec<3UL,_double> local_38;
  
  operator-(&local_58,(vec<3UL,_double> *)&z.y,(vec<3UL,_double> *)&stack0x00000020);
  pvVar1 = vec<3UL,_double>::normalize(&local_58);
  local_a8[2] = pvVar1->z;
  local_a8[0] = pvVar1->x;
  local_a8[1] = pvVar1->y;
  local_78.x = y.z * local_a8[2] - local_a8[1] * in_stack_00000048;
  local_78.y = in_stack_00000048 * local_a8[0] - local_a8[2] * y.y;
  local_78.z = y.y * local_a8[1] - local_a8[0] * y.z;
  local_a8[3] = local_a8[1];
  local_88 = local_a8[0];
  local_80 = local_a8[2];
  pvVar1 = vec<3UL,_double>::normalize(&local_78);
  local_58.z = pvVar1->z;
  local_58.x = pvVar1->x;
  local_58.y = pvVar1->y;
  local_38.x = local_a8[3] * local_58.z - local_58.y * local_80;
  local_38.y = local_80 * local_58.x - local_58.z * local_88;
  local_38.z = local_88 * local_58.y - local_58.x * local_a8[3];
  pvVar1 = vec<3UL,_double>::normalize(&local_38);
  local_78.x = pvVar1->x;
  local_78.y = pvVar1->y;
  local_78.z = pvVar1->z;
  in_RDI->rows[3].data[2] = 0.0;
  in_RDI->rows[3].data[3] = 0.0;
  in_RDI->rows[3].data[0] = 0.0;
  in_RDI->rows[3].data[1] = 0.0;
  in_RDI->rows[2].data[2] = 0.0;
  in_RDI->rows[2].data[3] = 0.0;
  in_RDI->rows[2].data[0] = 0.0;
  in_RDI->rows[2].data[1] = 0.0;
  in_RDI->rows[1].data[2] = 0.0;
  in_RDI->rows[1].data[3] = 0.0;
  in_RDI->rows[1].data[0] = 0.0;
  in_RDI->rows[1].data[1] = 0.0;
  in_RDI->rows[0].data[2] = 0.0;
  in_RDI->rows[0].data[3] = 0.0;
  in_RDI->rows[0].data[0] = 0.0;
  in_RDI->rows[0].data[1] = 0.0;
  pdVar2 = in_RDI->rows[3].data + 3;
  lVar3 = 3;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      dVar7 = 1.0;
      if (lVar4 != lVar5) {
        dVar7 = 0.0;
      }
      pdVar2[lVar5] = dVar7;
      lVar5 = lVar5 + -1;
    } while (lVar5 != -4);
    pdVar2 = pdVar2 + -4;
    lVar4 = lVar4 + -1;
    bVar6 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar6);
  lVar3 = 0;
  do {
    lVar4 = (ulong)(lVar3 != 8) * 8 + 8;
    if (lVar3 == 0) {
      lVar4 = 0;
    }
    *(undefined8 *)((long)in_RDI->rows[0].data + lVar3) = *(undefined8 *)((long)&local_58.x + lVar4)
    ;
    *(undefined8 *)((long)in_RDI->rows[1].data + lVar3) = *(undefined8 *)((long)&local_78.x + lVar4)
    ;
    *(undefined8 *)((long)in_RDI->rows[2].data + lVar3) = *(undefined8 *)((long)local_a8 + lVar4);
    *(ulong *)((long)in_RDI->rows[0].data + lVar3 * 4 + 0x18) =
         *(ulong *)((long)&((vec<3UL,_double> *)&stack0x00000020)->x + lVar4) ^ 0x8000000000000000;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  return in_RDI;
}

Assistant:

mat4 lookat(vec3f eye, vec3f center, vec3f up)
{
    vec3f z = (eye - center).normalize();
    vec3f x = cross(up, z).normalize();
    vec3f y = cross(z, x).normalize();
    mat4 ModelView = mat4::identity();
    for (int i = 0; i < 3; i++) {
        ModelView[0][i] = x[i];
        ModelView[1][i] = y[i];
        ModelView[2][i] = z[i];
        ModelView[i][3] = -center[i];
    }
    return ModelView;
}